

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

uint * getRevealedMerkleNodes
                 (tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,size_t *outputSize)

{
  ushort *puVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  void *__ptr;
  size_t sVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  if (missingLeaves != (uint16_t *)0x0 || missingLeavesSize == 0) {
    uVar10 = tree->numNodes;
    uVar12 = tree->numLeaves;
    __ptr = calloc((ulong)uVar10 + 0x3f >> 6,8);
    if (__ptr != (void *)0x0) {
      iVar11 = uVar10 - uVar12;
      if (missingLeavesSize != 0) {
        sVar5 = 0;
        do {
          puVar1 = missingLeaves + sVar5;
          sVar5 = sVar5 + 1;
          uVar8 = (uint)*puVar1 + iVar11;
          puVar2 = (ulong *)((long)__ptr + (ulong)(uVar8 >> 6) * 8);
          *puVar2 = *puVar2 | 1L << ((ulong)uVar8 & 0x3f);
        } while (missingLeavesSize != sVar5);
      }
      uVar8 = uVar10 >> 1;
      if (uVar8 - 1 != 0) {
        uVar9 = uVar8 * 4;
        uVar4 = uVar8 * 2;
        uVar7 = (ulong)(uVar8 - 1);
        do {
          if ((uVar7 < uVar10) &&
             ((tree->haveNodeExists[uVar4 - 2 >> 6] >> (uVar4 - 2 & 0x3e) & 1) != 0)) {
            if ((uVar4 < uVar10) && ((tree->haveNodeExists[uVar9 >> 6] >> (uVar9 & 0x3c) & 1) != 0))
            {
              if ((*(ulong *)((long)__ptr + (ulong)(uVar4 - 1 >> 6) * 8) >>
                   ((ulong)(uVar4 - 1) & 0x3f) & 1) == 0) goto LAB_00121a70;
              uVar13 = *(ulong *)((long)__ptr + (ulong)(uVar4 >> 6) * 8) >> (uVar4 & 0x3e);
            }
            else {
              uVar13 = *(ulong *)((long)__ptr + (ulong)(uVar4 - 1 >> 6) * 8) >>
                       ((ulong)(uVar4 - 1) & 0x3f);
            }
            if ((uVar13 & 1) != 0) {
              puVar2 = (ulong *)((long)__ptr + (uVar7 >> 6) * 8);
              *puVar2 = *puVar2 | 1L << (uVar7 & 0x3f);
            }
          }
LAB_00121a70:
          uVar7 = uVar7 - 1;
          uVar9 = uVar9 - 4;
          uVar4 = uVar4 - 2;
        } while ((int)uVar7 != 0);
      }
      puVar6 = (uint *)malloc((ulong)uVar12 << 2);
      if (puVar6 != (uint *)0x0) {
        sVar5 = 0;
        if (missingLeavesSize == 0) {
LAB_00121b2f:
          free(__ptr);
          *outputSize = sVar5;
          return puVar6;
        }
        uVar7 = 0;
LAB_00121aa8:
        uVar10 = (uint)missingLeaves[uVar7] + iVar11;
        do {
          uVar12 = (uVar10 + 1 >> 1) - 1;
          if ((*(ulong *)((long)__ptr + (ulong)(uVar12 >> 6) * 8) >> ((ulong)uVar12 & 0x3f) & 1) ==
              0) {
            uVar13 = sVar5 & 0xfffffffc;
            if (uVar13 == 0) {
              uVar13 = 0;
              goto LAB_00121b07;
            }
            auVar15 = vpbroadcastd_avx512vl();
            uVar14 = 0;
            goto LAB_00121aec;
          }
          uVar10 = uVar12;
        } while (uVar12 != 0);
        goto LAB_00121b22;
      }
      free(__ptr);
    }
  }
  return (uint *)0x0;
  while (uVar14 = uVar14 + 4, uVar14 < uVar13) {
LAB_00121aec:
    auVar3 = vpcmpeqd_avx(auVar15,*(undefined1 (*) [16])(puVar6 + uVar14));
    if ((((auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar3[0xf] < '\0')
    goto LAB_00121b22;
  }
LAB_00121b07:
  if (uVar13 < sVar5) {
    do {
      if (puVar6[uVar13] == uVar10) goto LAB_00121b22;
      uVar13 = uVar13 + 1;
    } while (sVar5 != uVar13);
  }
  puVar6[sVar5] = uVar10;
  sVar5 = (size_t)((int)sVar5 + 1);
LAB_00121b22:
  uVar7 = (ulong)((int)uVar7 + 1);
  if (missingLeavesSize <= uVar7) goto LAB_00121b2f;
  goto LAB_00121aa8;
}

Assistant:

static unsigned int* getRevealedMerkleNodes(const tree_t* tree, uint16_t* missingLeaves,
                                            size_t missingLeavesSize, size_t* outputSize) {
  if (!missingLeaves && missingLeavesSize) {
    return NULL;
  }

  const unsigned int firstLeaf = tree->numNodes - tree->numLeaves;
  bitset_word_t* missingNodes =
      calloc((tree->numNodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if (!missingNodes) {
    return NULL;
  }

  /* Mark leaves that are missing */
  for (size_t i = 0; i < missingLeavesSize; i++) {
    set_bit(missingNodes, firstLeaf + missingLeaves[i]);
  }

  /* For the nonleaf nodes, if both leaves are missing, mark it as missing too */
  for (unsigned int i = getParent(tree->numNodes - 1); i > 0; i--) {
    if (!exists(tree, i)) {
      continue;
    }
    if (exists(tree, 2 * i + 2)) {
      if (get_bit(missingNodes, 2 * i + 1) && get_bit(missingNodes, 2 * i + 2)) {
        set_bit(missingNodes, i);
      }
    } else {
      if (get_bit(missingNodes, 2 * i + 1)) {
        set_bit(missingNodes, i);
      }
    }
  }

  /* For each missing leaf node, add the highest missing node on the path
   * back to the root to the set to be revealed */
  unsigned int* revealed = malloc(tree->numLeaves * sizeof(unsigned int));
  if (!revealed) {
    free(missingNodes);
    return NULL;
  }

  unsigned int pos = 0;
  for (unsigned int i = 0; i < missingLeavesSize; i++) {
    /* input is leaf indexes, translate to nodes */
    unsigned int node = missingLeaves[i] + firstLeaf;
    do {
      if (!get_bit(missingNodes, getParent(node))) {
        if (!contains(revealed, pos, node)) {
          revealed[pos] = node;
          pos++;
        }
        break;
      }
    } while ((node = getParent(node)) != 0);
  }

  free(missingNodes);
  *outputSize = pos;
  return revealed;
}